

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radio.cpp
# Opt level: O3

int __thiscall zmq::radio_t::xsetsockopt(radio_t *this,int option_,void *optval_,size_t optvallen_)

{
  int iVar1;
  int *piVar2;
  
  if (((optvallen_ == 4) && (-1 < *optval_)) && (option_ == 0x45)) {
    this->_lossy = *optval_ == 0;
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int zmq::radio_t::xsetsockopt (int option_,
                               const void *optval_,
                               size_t optvallen_)
{
    if (optvallen_ != sizeof (int) || *static_cast<const int *> (optval_) < 0) {
        errno = EINVAL;
        return -1;
    }
    if (option_ == ZMQ_XPUB_NODROP)
        _lossy = (*static_cast<const int *> (optval_) == 0);
    else {
        errno = EINVAL;
        return -1;
    }
    return 0;
}